

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O2

bool ImNodes::RenderConnection(ImVec2 *input_pos,ImVec2 *output_pos,float thickness)

{
  ImVector<ImVec2> *this;
  bool bVar1;
  float *pfVar2;
  ImU32 col;
  ImDrawList *this_00;
  ImVec2 *a;
  ImVec2 *b;
  int i;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVec2 p3;
  ImVec2 p2;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  this_00 = ImGui::GetWindowDrawList();
  pfVar2 = gCanvas;
  ImGui::GetStyle();
  fVar5 = *pfVar2;
  fVar3 = fVar5 * 100.0;
  local_38.x = input_pos->x - fVar3;
  local_38.y = input_pos->y;
  local_40.y = (*output_pos).y + 0.0;
  local_40.x = fVar3 + (*output_pos).x;
  this = &this_00->_Path;
  ImVector<ImVec2>::push_back(this,input_pos);
  i = 0;
  ImDrawList::PathBezierCurveTo(this_00,&local_38,&local_40,output_pos,0);
  fVar3 = 3.4028235e+38;
  while (i < this->Size + -1) {
    local_48 = ImGui::GetMousePos();
    a = ImVector<ImVec2>::operator[](this,i);
    i = i + 1;
    b = ImVector<ImVec2>::operator[](this,i);
    fVar4 = GetDistanceToLineSquared(&local_48,a,b);
    if (fVar4 <= fVar3) {
      fVar3 = fVar4;
    }
  }
  fVar5 = fVar5 * thickness;
  bVar1 = fVar3 <= fVar5 * fVar5;
  col = ImGui::ColorConvertFloat4ToU32((ImVec4 *)(pfVar2 + (ulong)bVar1 * 4 + 0x13));
  ImDrawList::PathStroke(this_00,col,false,fVar5);
  return bVar1;
}

Assistant:

bool RenderConnection(const ImVec2& input_pos, const ImVec2& output_pos, float thickness)
{
    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    CanvasState* canvas = gCanvas;
    const ImGuiStyle& style = ImGui::GetStyle();

    thickness *= canvas->zoom;

    ImVec2 p2 = input_pos - ImVec2{100 * canvas->zoom, 0};
    ImVec2 p3 = output_pos + ImVec2{100 * canvas->zoom, 0};

    // Assemble segments for path
    draw_list->PathLineTo(input_pos);
    draw_list->PathBezierCurveTo(p2, p3, output_pos, 0);

    // Check each segment and determine if mouse is hovering curve that is to be drawn
    float min_square_distance = FLT_MAX;
    for (int i = 0; i < draw_list->_Path.size() - 1; i++)
    {
        min_square_distance = ImMin(min_square_distance,
            GetDistanceToLineSquared(ImGui::GetMousePos(), draw_list->_Path[i], draw_list->_Path[i + 1]));
    }

    // Draw curve, change when it is hovered
    bool is_close = min_square_distance <= thickness * thickness;
    draw_list->PathStroke(is_close ? canvas->colors[ColConnectionActive] : canvas->colors[ColConnection], false, thickness);
    return is_close;
}